

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O2

int ecjpake_write_len_point(uchar **p,uchar *end,mbedtls_ecp_group *grp,int pf,mbedtls_ecp_point *P)

{
  uchar *puVar1;
  int iVar2;
  size_t local_18;
  size_t len;
  
  puVar1 = *p;
  iVar2 = -0x4f00;
  if ((puVar1 <= end) && (4 < (long)end - (long)puVar1)) {
    local_18 = 0xffffb100;
    iVar2 = mbedtls_ecp_point_write_binary
                      (grp,P,pf,&local_18,puVar1 + 4,(long)end - (long)(puVar1 + 4));
    if (iVar2 == 0) {
      *(uint *)*p = (uint)local_18 >> 0x18 | ((uint)local_18 & 0xff0000) >> 8 |
                    ((uint)local_18 & 0xff00) << 8 | (uint)local_18 << 0x18;
      *p = *p + local_18 + 4;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int ecjpake_write_len_point(unsigned char **p,
                                   const unsigned char *end,
                                   const mbedtls_ecp_group *grp,
                                   const int pf,
                                   const mbedtls_ecp_point *P)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    /* Need at least 4 for length plus 1 for point */
    if (end < *p || end - *p < 5) {
        return MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
    }

    ret = mbedtls_ecp_point_write_binary(grp, P, pf,
                                         &len, *p + 4, end - (*p + 4));
    if (ret != 0) {
        return ret;
    }

    MBEDTLS_PUT_UINT32_BE(len, *p, 0);

    *p += 4 + len;

    return 0;
}